

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNativeCoordMappingTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::anon_unknown_0::NativeCoordMappingCase::executeForConfig
          (NativeCoordMappingCase *this,EGLDisplay display,EGLConfig config)

{
  glActiveTextureFunc *pp_Var1;
  NativeType NVar2;
  TestLog *pTVar3;
  NativeDisplay *pNVar4;
  bool bVar5;
  EGLint EVar6;
  deUint32 dVar7;
  int iVar8;
  Library *pLVar9;
  NativeWindowFactory *pNVar10;
  NativePixmapFactory *pNVar11;
  NotSupportedError *pNVar12;
  undefined4 extraout_var;
  NativePixmap *pNVar13;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  EGLSurface pvVar14;
  NativeWindow *window;
  undefined4 extraout_var_03;
  undefined8 uVar15;
  TestError *this_00;
  _func_int **pp_Var16;
  int iVar17;
  int in_stack_ffffffffffffe4c8;
  int iVar18;
  UniquePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> nativePixmap;
  IVec2 surfaceSize;
  UniqueSurface surface;
  TextureLevel result;
  Vec4 local_1ab8;
  ScopedLogSection logSection;
  UniqueContext context;
  IVec2 screenSize;
  string configIdStr;
  Functions gl;
  undefined4 extraout_var_02;
  
  pLVar9 = EglTestContext::getLibrary((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  EVar6 = eglu::getConfigAttribInt(pLVar9,display,config,0x3028);
  gl.activeShaderProgram = (glActiveShaderProgramFunc)CONCAT44(gl.activeShaderProgram._4_4_,EVar6);
  de::toString<int>(&configIdStr,(int *)&gl);
  pTVar3 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 "Config ID ",&configIdStr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gl,(char *)result.m_format,(allocator<char> *)&local_1ab8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&context,
                 "Config ID ",&configIdStr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&surface,(char *)context.m_egl,(allocator<char> *)&nativePixmap);
  tcu::ScopedLogSection::ScopedLogSection(&logSection,pTVar3,(string *)&gl,(string *)&surface);
  std::__cxx11::string::~string((string *)&surface);
  std::__cxx11::string::~string((string *)&context);
  std::__cxx11::string::~string((string *)&gl);
  std::__cxx11::string::~string((string *)&result);
  pTVar3 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
  NVar2 = this->m_nativeType;
  pp_Var1 = &gl.activeTexture;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pp_Var1);
  std::operator<<((ostream *)pp_Var1,"EGL_RED_SIZE: ");
  EVar6 = eglu::getConfigAttribInt(pLVar9,display,config,0x3024);
  std::ostream::operator<<(pp_Var1,EVar6);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pp_Var1);
  pp_Var1 = &gl.activeTexture;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pp_Var1);
  std::operator<<((ostream *)pp_Var1,"EGL_GREEN_SIZE: ");
  EVar6 = eglu::getConfigAttribInt(pLVar9,display,config,0x3023);
  std::ostream::operator<<(pp_Var1,EVar6);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pp_Var1);
  pp_Var1 = &gl.activeTexture;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pp_Var1);
  std::operator<<((ostream *)pp_Var1,"EGL_BLUE_SIZE: ");
  EVar6 = eglu::getConfigAttribInt(pLVar9,display,config,0x3022);
  std::ostream::operator<<(pp_Var1,EVar6);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pp_Var1);
  pp_Var1 = &gl.activeTexture;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pp_Var1);
  std::operator<<((ostream *)pp_Var1,"EGL_ALPHA_SIZE: ");
  EVar6 = eglu::getConfigAttribInt(pLVar9,display,config,0x3021);
  std::ostream::operator<<(pp_Var1,EVar6);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pp_Var1);
  pp_Var1 = &gl.activeTexture;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pp_Var1);
  std::operator<<((ostream *)pp_Var1,"EGL_DEPTH_SIZE: ");
  EVar6 = eglu::getConfigAttribInt(pLVar9,display,config,0x3025);
  std::ostream::operator<<(pp_Var1,EVar6);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pp_Var1);
  pp_Var1 = &gl.activeTexture;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pp_Var1);
  std::operator<<((ostream *)pp_Var1,"EGL_STENCIL_SIZE: ");
  EVar6 = eglu::getConfigAttribInt(pLVar9,display,config,0x3026);
  std::ostream::operator<<(pp_Var1,EVar6);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pp_Var1);
  pp_Var1 = &gl.activeTexture;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pp_Var1);
  std::operator<<((ostream *)pp_Var1,"EGL_SAMPLES: ");
  EVar6 = eglu::getConfigAttribInt(pLVar9,display,config,0x3031);
  std::ostream::operator<<(pp_Var1,EVar6);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pp_Var1);
  if (NVar2 == NATIVETYPE_WINDOW) {
    pp_Var1 = &gl.activeTexture;
    gl.activeShaderProgram = (glActiveShaderProgramFunc)pTVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pp_Var1);
    std::operator<<((ostream *)pp_Var1,"Waiting ");
    std::ostream::operator<<(pp_Var1,0x50);
    std::operator<<((ostream *)pp_Var1,
                    "ms after eglSwapBuffers() and glFinish() for frame to become visible");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pp_Var1);
  }
  pNVar10 = eglu::selectNativeWindowFactory
                      (((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->
                       m_nativeDisplayFactory,
                       ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx)->m_cmdLine);
  if ((pNVar10->m_capabilities & CAPABILITY_READ_SCREEN_PIXELS) == 0) {
    pNVar12 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar12,"Native window doesn\'t support readPixels()",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
               ,0x209);
    __cxa_throw(pNVar12,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pNVar11 = eglu::selectNativePixmapFactory
                      (((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->
                       m_nativeDisplayFactory,
                       ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx)->m_cmdLine);
  if (this->m_nativeType == NATIVETYPE_PBUFFER_COPY_TO_PIXMAP) {
    if ((~*(uint *)(pNVar11 + 0x48) & 5) != 0) {
      pNVar12 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar12,"Native pixmap doesn\'t support readPixels() or legacy create surface",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                 ,0x220);
      goto LAB_0021788a;
    }
  }
  else if ((this->m_nativeType == NATIVETYPE_PIXMAP) && (((byte)pNVar11[0x48] & 4) == 0)) {
    pNVar12 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar12,"Native pixmap doesn\'t support readPixels()",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
               ,0x21a);
LAB_0021788a:
    __cxa_throw(pNVar12,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  gl.activeShaderProgram = (glActiveShaderProgramFunc)0x200003098;
  gl.activeTexture._0_4_ = 0x3038;
  (**pLVar9->_vptr_Library)(pLVar9,0x30a0);
  dVar7 = (*pLVar9->_vptr_Library[0x1f])(pLVar9);
  eglu::checkError(dVar7,"bindAPI(EGL_OPENGL_ES_API)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                   ,0x50);
  iVar8 = (*pLVar9->_vptr_Library[6])(pLVar9,display,config,0);
  dVar7 = (*pLVar9->_vptr_Library[0x1f])(pLVar9);
  eglu::checkError(dVar7,"eglCreateContext() failed",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                   ,0x53);
  if ((EGLContext)CONCAT44(extraout_var,iVar8) == (EGLContext)0x0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"context",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
               ,0x54);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  eglu::UniqueContext::UniqueContext
            (&context,pLVar9,display,(EGLContext)CONCAT44(extraout_var,iVar8));
  glw::Functions::Functions(&gl);
  EglTestContext::initGLFunctions
            ((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx,&gl,(ApiType)0x2);
  NVar2 = this->m_nativeType;
  if (NVar2 == NATIVETYPE_WINDOW) {
    result.m_format.order = 0x80;
    result.m_format.type = 0x80;
    result.m_size.m_data[0] = 1;
    iVar8 = (*(pNVar10->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                      (pNVar10,(((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->
                               m_nativeDisplay).
                               super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                               .m_data.ptr,display,config);
    window = (NativeWindow *)CONCAT44(extraout_var_02,iVar8);
    pTVar3 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
             ->m_log;
    pNVar4 = (((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->m_nativeDisplay).
             super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.m_data.
             ptr;
    bVar5 = this->m_render;
    nativePixmap.super_UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>.
    m_data.ptr = (NativePixmap *)window;
    iVar8 = (*pNVar4->_vptr_NativeDisplay[2])(pNVar4);
    pLVar9 = (Library *)CONCAT44(extraout_var_03,iVar8);
    (*window->_vptr_NativeWindow[7])(&screenSize,window);
    pvVar14 = eglu::createWindowSurface(pNVar4,window,display,config,(EGLAttrib *)0x0);
    eglu::UniqueSurface::UniqueSurface(&surface,pLVar9,display,pvVar14);
    eglu::getSurfaceSize((eglu *)&surfaceSize,pLVar9,display,surface.m_surface);
    tcu::TextureLevel::TextureLevel(&result);
    (*pLVar9->_vptr_Library[0x27])
              (pLVar9,display,surface.m_surface,surface.m_surface,context.m_context);
    dVar7 = (*pLVar9->_vptr_Library[0x1f])(pLVar9);
    eglu::checkError(dVar7,"makeCurrent(display, *surface, *surface, context)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                     ,0x17d);
    dVar7 = 0;
    if (bVar5 != false) {
      dVar7 = createGLES2Program(&gl,pTVar3);
    }
    local_1ab8.m_data[0] = 0.0;
    local_1ab8.m_data[1] = 0.0;
    local_1ab8.m_data[2] = 0.0;
    local_1ab8.m_data[3] = 1.0;
    iVar8 = surfaceSize.m_data[1];
    iVar18 = surfaceSize.m_data[0];
    anon_unknown_0::clear(&gl,&local_1ab8,0,0,surfaceSize.m_data[0],surfaceSize.m_data[1]);
    if (bVar5 == false) {
      local_1ab8.m_data[0] = 1.0;
      local_1ab8.m_data[1] = 1.0;
      local_1ab8.m_data[2] = 1.0;
      local_1ab8.m_data[3] = 1.0;
      iVar18 = 0x40;
      iVar8 = 0x48;
      anon_unknown_0::clear(&gl,&local_1ab8,8,0x10,0x40,0x48);
    }
    else {
      render(&gl,dVar7,surfaceSize.m_data[0],surfaceSize.m_data[1],iVar18,iVar8,
             in_stack_ffffffffffffe4c8,(int)pTVar3);
    }
    (*pLVar9->_vptr_Library[0x31])(pLVar9,display,surface.m_surface);
    dVar7 = (*pLVar9->_vptr_Library[0x1f])(pLVar9);
    eglu::checkError(dVar7,"swapBuffers(display, *surface)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                     ,0x189);
    (*pLVar9->_vptr_Library[0x36])(pLVar9);
    dVar7 = (*pLVar9->_vptr_Library[0x1f])(pLVar9);
    iVar17 = 0x18a;
    eglu::checkError(dVar7,"waitClient()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                     ,0x18a);
    deSleep(0x50);
    (*window->_vptr_NativeWindow[8])(window,&result);
    bVar5 = validate(pTVar3,&result,screenSize.m_data[1] + -0x58,iVar17,iVar18,iVar8);
    (*pLVar9->_vptr_Library[0x27])(pLVar9,display,0,0,0);
    dVar7 = (*pLVar9->_vptr_Library[0x1f])(pLVar9);
    eglu::checkError(dVar7,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                     ,0x191);
    tcu::TextureLevel::~TextureLevel(&result);
    eglu::UniqueSurface::~UniqueSurface(&surface);
    if (!bVar5) {
      tcu::TestContext::setTestResult
                ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Invalid color rendered");
    }
    de::details::UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::
    ~UniqueBase((UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *)
                &nativePixmap);
  }
  else {
    if (NVar2 == NATIVETYPE_PIXMAP) {
      iVar18 = 0x80;
      pNVar13 = (NativePixmap *)
                (**(code **)(*(long *)pNVar11 + 0x20))
                          (pNVar11,(((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->
                                   m_nativeDisplay).
                                   super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                                   .m_data.ptr,display,config,0,0x80);
      pTVar3 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
      pNVar4 = (((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->m_nativeDisplay).
               super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.
               m_data.ptr;
      bVar5 = this->m_render;
      nativePixmap.super_UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>.
      m_data.ptr = pNVar13;
      iVar8 = (*pNVar4->_vptr_NativeDisplay[2])(pNVar4);
      pLVar9 = (Library *)CONCAT44(extraout_var_01,iVar8);
      pvVar14 = eglu::createPixmapSurface(pNVar4,pNVar13,display,config,(EGLAttrib *)0x0);
      eglu::UniqueSurface::UniqueSurface(&surface,pLVar9,display,pvVar14);
      tcu::TextureLevel::TextureLevel(&result);
      (*pLVar9->_vptr_Library[0x27])
                (pLVar9,display,surface.m_surface,surface.m_surface,context.m_context);
      dVar7 = (*pLVar9->_vptr_Library[0x1f])(pLVar9);
      eglu::checkError(dVar7,"makeCurrent(display, *surface, *surface, context)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                       ,0x1ac);
      dVar7 = 0;
      if (bVar5 != false) {
        dVar7 = createGLES2Program(&gl,pTVar3);
      }
      local_1ab8.m_data[0] = 0.0;
      local_1ab8.m_data[1] = 0.0;
      local_1ab8.m_data[2] = 0.0;
      local_1ab8.m_data[3] = 1.0;
      iVar8 = 0x80;
      iVar17 = 0x80;
      anon_unknown_0::clear(&gl,&local_1ab8,0,0,0x80,0x80);
      if (bVar5 == false) {
        local_1ab8.m_data[0] = 1.0;
        local_1ab8.m_data[1] = 1.0;
        local_1ab8.m_data[2] = 1.0;
        local_1ab8.m_data[3] = 1.0;
        iVar8 = 0x40;
        iVar17 = 0x48;
        anon_unknown_0::clear(&gl,&local_1ab8,8,0x10,0x40,0x48);
      }
      else {
        render(&gl,dVar7,0x80,0x80,iVar8,iVar17,iVar18,(int)pNVar13);
      }
      (*pLVar9->_vptr_Library[0x36])(pLVar9);
      dVar7 = (*pLVar9->_vptr_Library[0x1f])(pLVar9);
      iVar18 = 0x1b8;
      eglu::checkError(dVar7,"waitClient()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                       ,0x1b8);
      (**(code **)(*(long *)pNVar13 + 0x20))(pNVar13,&result);
      bVar5 = validate(pTVar3,&result,0x27,iVar18,iVar8,iVar17);
      (*pLVar9->_vptr_Library[0x27])(pLVar9,display,0,0,0);
      dVar7 = (*pLVar9->_vptr_Library[0x1f])(pLVar9);
      eglu::checkError(dVar7,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                       ,0x1be);
      tcu::TextureLevel::~TextureLevel(&result);
      eglu::UniqueSurface::~UniqueSurface(&surface);
      if (!bVar5) {
        tcu::TestContext::setTestResult
                  ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_FAIL,"Invalid color rendered");
      }
    }
    else {
      if (NVar2 != NATIVETYPE_PBUFFER_COPY_TO_PIXMAP) goto LAB_002177a5;
      iVar18 = 0x80;
      pNVar13 = (NativePixmap *)
                (**(code **)(*(long *)pNVar11 + 0x20))
                          (pNVar11,(((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->
                                   m_nativeDisplay).
                                   super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                                   .m_data.ptr,display,config,0,0x80);
      pTVar3 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
      bVar5 = this->m_render;
      nativePixmap.super_UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>.
      m_data.ptr = pNVar13;
      iVar8 = (*pLVar9->_vptr_Library[10])(pLVar9,display,config,0);
      eglu::UniqueSurface::UniqueSurface
                (&surface,pLVar9,display,(EGLSurface)CONCAT44(extraout_var_00,iVar8));
      tcu::TextureLevel::TextureLevel(&result);
      (*pLVar9->_vptr_Library[0x27])
                (pLVar9,display,surface.m_surface,surface.m_surface,context.m_context);
      dVar7 = (*pLVar9->_vptr_Library[0x1f])(pLVar9);
      eglu::checkError(dVar7,"makeCurrent(display, *surface, *surface, context)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                       ,0x1d8);
      dVar7 = 0;
      if (bVar5 != false) {
        dVar7 = createGLES2Program(&gl,pTVar3);
      }
      local_1ab8.m_data[0] = 0.0;
      local_1ab8.m_data[1] = 0.0;
      local_1ab8.m_data[2] = 0.0;
      local_1ab8.m_data[3] = 1.0;
      iVar8 = 0x80;
      iVar17 = 0x80;
      anon_unknown_0::clear(&gl,&local_1ab8,0,0,0x80,0x80);
      if (bVar5 == false) {
        local_1ab8.m_data[0] = 1.0;
        local_1ab8.m_data[1] = 1.0;
        local_1ab8.m_data[2] = 1.0;
        local_1ab8.m_data[3] = 1.0;
        iVar17 = 0x48;
        anon_unknown_0::clear(&gl,&local_1ab8,8,0x10,0x40,0x48);
      }
      else {
        render(&gl,dVar7,0x80,0x80,iVar8,iVar17,iVar18,(int)pNVar13);
      }
      uVar15 = (**(code **)(*(long *)pNVar13 + 0x10))(pNVar13);
      pp_Var16 = pLVar9->_vptr_Library;
      (*pp_Var16[5])(pLVar9,display,surface.m_surface,uVar15);
      iVar18 = (int)pp_Var16;
      dVar7 = (*pLVar9->_vptr_Library[0x1f])(pLVar9);
      eglu::checkError(dVar7,"copyBuffers(display, *surface, nativePixmap.getLegacyNative())",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                       ,0x1e4);
      (*pLVar9->_vptr_Library[0x36])(pLVar9);
      dVar7 = (*pLVar9->_vptr_Library[0x1f])(pLVar9);
      iVar8 = 0x1e5;
      eglu::checkError(dVar7,"waitClient()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                       ,0x1e5);
      (**(code **)(*(long *)pNVar13 + 0x20))(pNVar13,&result);
      bVar5 = validate(pTVar3,&result,0x6f,iVar8,iVar18,iVar17);
      (*pLVar9->_vptr_Library[0x27])(pLVar9,display,0,0,0);
      dVar7 = (*pLVar9->_vptr_Library[0x1f])(pLVar9);
      eglu::checkError(dVar7,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                       ,0x1eb);
      tcu::TextureLevel::~TextureLevel(&result);
      eglu::UniqueSurface::~UniqueSurface(&surface);
      if (!bVar5) {
        tcu::TestContext::setTestResult
                  ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_FAIL,"Invalid color rendered");
      }
    }
    de::details::UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>::
    ~UniqueBase(&nativePixmap.
                 super_UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>);
  }
LAB_002177a5:
  eglu::UniqueContext::~UniqueContext(&context);
  tcu::ScopedLogSection::~ScopedLogSection(&logSection);
  std::__cxx11::string::~string((string *)&configIdStr);
  return;
}

Assistant:

void NativeCoordMappingCase::executeForConfig (EGLDisplay display, EGLConfig config)
{
	const Library&						egl				= m_eglTestCtx.getLibrary();
	const string						configIdStr		(de::toString(eglu::getConfigAttribInt(egl, display, config, EGL_CONFIG_ID)));
	tcu::ScopedLogSection				logSection		(m_testCtx.getLog(), ("Config ID " + configIdStr).c_str(), ("Config ID " + configIdStr).c_str());
	const int							waitFrames		= 5;
	const int							width			= 128;
	const int							height			= 128;
	const eglu::NativeWindowFactory*	windowFactory;
	const eglu::NativePixmapFactory*	pixmapFactory;

	logConfigInfo(m_testCtx.getLog(), egl, display, config, m_nativeType, waitFrames);

	try
	{
		windowFactory = &eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

		if ((windowFactory->getCapabilities() & eglu::NativeWindow::CAPABILITY_READ_SCREEN_PIXELS) == 0)
			TCU_THROW(NotSupportedError, "Native window doesn't support readPixels()");
	}
	catch (const tcu::NotSupportedError&)
	{
		if (m_nativeType == NATIVETYPE_WINDOW)
			throw;
		else
			windowFactory = DE_NULL;
	}

	try
	{
		pixmapFactory = &eglu::selectNativePixmapFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

		if (m_nativeType == NATIVETYPE_PIXMAP)
		{
			if ((pixmapFactory->getCapabilities() & eglu::NativePixmap::CAPABILITY_READ_PIXELS) == 0)
				TCU_THROW(NotSupportedError, "Native pixmap doesn't support readPixels()");
		}
		else if (m_nativeType == NATIVETYPE_PBUFFER_COPY_TO_PIXMAP)
		{
			if ((pixmapFactory->getCapabilities() & eglu::NativePixmap::CAPABILITY_READ_PIXELS) == 0 ||
				(pixmapFactory->getCapabilities() & eglu::NativePixmap::CAPABILITY_CREATE_SURFACE_LEGACY) == 0)
				TCU_THROW(NotSupportedError, "Native pixmap doesn't support readPixels() or legacy create surface");
		}
	}
	catch (const tcu::NotSupportedError&)
	{
		if (m_nativeType == NATIVETYPE_PIXMAP || m_nativeType == NATIVETYPE_PBUFFER_COPY_TO_PIXMAP)
			throw;
		else
			pixmapFactory = DE_NULL;
	}

	DE_ASSERT(m_nativeType != NATIVETYPE_WINDOW || windowFactory);
	DE_ASSERT((m_nativeType != NATIVETYPE_PIXMAP && m_nativeType != NATIVETYPE_PBUFFER_COPY_TO_PIXMAP) || pixmapFactory);

	eglu::UniqueContext		context		(egl, display, createGLES2Context(egl, display, config));
	glw::Functions			gl;

	m_eglTestCtx.initGLFunctions(&gl, glu::ApiType::es(2,0));

	switch (m_nativeType)
	{
		case NATIVETYPE_WINDOW:
		{
			de::UniquePtr<eglu::NativeWindow>	nativeWindow	(windowFactory->createWindow(&m_eglTestCtx.getNativeDisplay(), display, config, DE_NULL, eglu::WindowParams(width, height, eglu::WindowParams::VISIBILITY_VISIBLE)));

			if (!testNativeWindow(m_testCtx.getLog(), m_eglTestCtx.getNativeDisplay(), *nativeWindow, display, *context, config, gl, m_render, waitFrames))
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid color rendered");

			break;
		}

		case NATIVETYPE_PIXMAP:
		{
			de::UniquePtr<eglu::NativePixmap> nativePixmap		(pixmapFactory->createPixmap(&m_eglTestCtx.getNativeDisplay(), display, config, DE_NULL, width, height));

			if (!testNativePixmap(m_testCtx.getLog(), m_eglTestCtx.getNativeDisplay(), *nativePixmap, width, height, display, *context, config, gl, m_render))
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid color rendered");

			break;
		}

		case NATIVETYPE_PBUFFER_COPY_TO_PIXMAP:
		{
			de::UniquePtr<eglu::NativePixmap> nativePixmap		(pixmapFactory->createPixmap(&m_eglTestCtx.getNativeDisplay(), display, config, DE_NULL, width, height));

			if (!testNativePixmapCopy(m_testCtx.getLog(), egl, *nativePixmap, width, height, display, *context, config, gl, m_render))
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid color rendered");

			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
	}
}